

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm_vecsmall::SmallVectorTemplateBase<Command::Arg,_false>::grow
          (SmallVectorTemplateBase<Command::Arg,_false> *this,size_t MinSize)

{
  bool bVar1;
  size_t sVar2;
  size_type sVar3;
  Arg *Dest;
  iterator pAVar4;
  iterator pAVar5;
  Arg *NewElts;
  size_t NewCapacity;
  size_t CurSize;
  size_t CurCapacity;
  size_t MinSize_local;
  SmallVectorTemplateBase<Command::Arg,_false> *this_local;
  
  sVar2 = SmallVectorTemplateCommon<Command::Arg,_void>::capacity
                    (&this->super_SmallVectorTemplateCommon<Command::Arg,_void>);
  sVar3 = SmallVectorTemplateCommon<Command::Arg,_void>::size
                    (&this->super_SmallVectorTemplateCommon<Command::Arg,_void>);
  NewElts = (Arg *)detail::NextPowerOf2(sVar2 + 2);
  if (NewElts < MinSize) {
    NewElts = (Arg *)MinSize;
  }
  Dest = (Arg *)malloc((long)NewElts << 5);
  pAVar4 = SmallVectorTemplateCommon<Command::Arg,_void>::begin
                     (&this->super_SmallVectorTemplateCommon<Command::Arg,_void>);
  pAVar5 = SmallVectorTemplateCommon<Command::Arg,_void>::end
                     (&this->super_SmallVectorTemplateCommon<Command::Arg,_void>);
  SmallVectorTemplateBase<Command::Arg,false>::uninitialized_move<Command::Arg*,Command::Arg*>
            (pAVar4,pAVar5,Dest);
  pAVar4 = SmallVectorTemplateCommon<Command::Arg,_void>::begin
                     (&this->super_SmallVectorTemplateCommon<Command::Arg,_void>);
  pAVar5 = SmallVectorTemplateCommon<Command::Arg,_void>::end
                     (&this->super_SmallVectorTemplateCommon<Command::Arg,_void>);
  destroy_range(pAVar4,pAVar5);
  bVar1 = SmallVectorTemplateCommon<Command::Arg,_void>::isSmall
                    (&this->super_SmallVectorTemplateCommon<Command::Arg,_void>);
  if (!bVar1) {
    pAVar4 = SmallVectorTemplateCommon<Command::Arg,_void>::begin
                       (&this->super_SmallVectorTemplateCommon<Command::Arg,_void>);
    free(pAVar4);
  }
  SmallVectorTemplateCommon<Command::Arg,_void>::setEnd
            (&this->super_SmallVectorTemplateCommon<Command::Arg,_void>,Dest + sVar3);
  (this->super_SmallVectorTemplateCommon<Command::Arg,_void>).super_SmallVectorBase.BeginX = Dest;
  pAVar4 = SmallVectorTemplateCommon<Command::Arg,_void>::begin
                     (&this->super_SmallVectorTemplateCommon<Command::Arg,_void>);
  (this->super_SmallVectorTemplateCommon<Command::Arg,_void>).super_SmallVectorBase.CapacityX =
       pAVar4 + (long)NewElts;
  return;
}

Assistant:

void SmallVectorTemplateBase<T, isPodLike>::grow(size_t MinSize) {
  size_t CurCapacity = this->capacity();
  size_t CurSize = this->size();
  // Always grow, even from zero.
  size_t NewCapacity = size_t(llvm_vecsmall::detail::NextPowerOf2(CurCapacity+2));
  if (NewCapacity < MinSize)
    NewCapacity = MinSize;
  T *NewElts = static_cast<T*>(malloc(NewCapacity*sizeof(T)));

  // Move the elements over.
  this->uninitialized_move(this->begin(), this->end(), NewElts);

  // Destroy the original elements.
  destroy_range(this->begin(), this->end());

  // If this wasn't grown from the inline copy, deallocate the old space.
  if (!this->isSmall())
    free(this->begin());

  this->setEnd(NewElts+CurSize);
  this->BeginX = NewElts;
  this->CapacityX = this->begin()+NewCapacity;
}